

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

Integer * copy_map(int *block,int block_ndim,int *map)

{
  int iVar1;
  ulong uVar2;
  Integer *pIVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  if (0 < block_ndim) {
    uVar2 = 0;
    uVar7 = 0;
    do {
      uVar7 = (long)(int)uVar7 + (long)block[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)block_ndim != uVar2);
    pIVar3 = (Integer *)malloc(uVar7 * 8);
    if (0 < block_ndim) {
      uVar2 = 0;
      iVar4 = 0;
      do {
        iVar1 = block[uVar2];
        uVar6 = (int)uVar7 - iVar1;
        uVar7 = (ulong)uVar6;
        if (0 < (long)iVar1) {
          lVar5 = 0;
          do {
            pIVar3[(int)uVar6 + lVar5] = (long)map[iVar4 + lVar5] + 1;
            lVar5 = lVar5 + 1;
          } while (iVar1 != lVar5);
        }
        iVar4 = iVar1 + iVar4;
        uVar2 = uVar2 + 1;
      } while (uVar2 != (uint)block_ndim);
    }
    return pIVar3;
  }
  pIVar3 = (Integer *)malloc(0);
  return pIVar3;
}

Assistant:

static Integer* copy_map(int block[], int block_ndim, int map[])
{
    int d;
    int i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}